

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

u32 sqlite3FkOldmask(Parse *pParse,Table *pTab)

{
  int iVar1;
  FKey **ppFVar2;
  FKey *pFVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  Index *pIdx;
  
  uVar4 = 0;
  if ((pParse->db->flags & 0x80000) != 0) {
    ppFVar2 = &pTab->pFKey;
    uVar4 = 0;
    while( true ) {
      pFVar3 = *ppFVar2;
      if (pFVar3 == (FKey *)0x0) break;
      uVar6 = pFVar3->nCol;
      if (pFVar3->nCol < 1) {
        uVar6 = 0;
      }
      for (lVar7 = 0; (ulong)uVar6 * 0x10 != lVar7; lVar7 = lVar7 + 0x10) {
        iVar1 = *(int *)((long)&pFVar3->aCol[0].iFrom + lVar7);
        uVar8 = 1 << ((byte)iVar1 & 0x1f);
        if (0x1f < iVar1) {
          uVar8 = 0xffffffff;
        }
        uVar4 = uVar4 | uVar8;
      }
      ppFVar2 = &pFVar3->pNextFrom;
    }
    for (pFVar3 = sqlite3FkReferences(pTab); pFVar3 != (FKey *)0x0; pFVar3 = pFVar3->pNextTo) {
      pIdx = (Index *)0x0;
      sqlite3FkLocateIndex(pParse,pTab,pFVar3,&pIdx,(int **)0x0);
      if (pIdx != (Index *)0x0) {
        for (uVar5 = 0; pIdx->nKeyCol != uVar5; uVar5 = uVar5 + 1) {
          uVar6 = 1 << ((byte)pIdx->aiColumn[uVar5] & 0x1f);
          if (0x1f < pIdx->aiColumn[uVar5]) {
            uVar6 = 0xffffffff;
          }
          uVar4 = uVar4 | uVar6;
        }
      }
    }
  }
  return uVar4;
}

Assistant:

SQLITE_PRIVATE u32 sqlite3FkOldmask(
  Parse *pParse,                  /* Parse context */
  Table *pTab                     /* Table being modified */
){
  u32 mask = 0;
  if( pParse->db->flags&SQLITE_ForeignKeys ){
    FKey *p;
    int i;
    for(p=pTab->pFKey; p; p=p->pNextFrom){
      for(i=0; i<p->nCol; i++) mask |= COLUMN_MASK(p->aCol[i].iFrom);
    }
    for(p=sqlite3FkReferences(pTab); p; p=p->pNextTo){
      Index *pIdx = 0;
      sqlite3FkLocateIndex(pParse, pTab, p, &pIdx, 0);
      if( pIdx ){
        for(i=0; i<pIdx->nKeyCol; i++) mask |= COLUMN_MASK(pIdx->aiColumn[i]);
      }
    }
  }
  return mask;
}